

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::writeWithFds
          (AsyncPipe *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  AsyncCapabilityStream *pAVar1;
  size_t sVar2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  void *pvVar3;
  ArrayPtr<const_unsigned_char> *pAVar4;
  uchar *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long in_R9;
  bool bVar8;
  ArrayPtr<const_unsigned_char> writeBuffer;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault local_60;
  undefined1 local_58 [16];
  char *pcStack_48;
  undefined8 local_40;
  bool local_38;
  
  puVar5 = (uchar *)data.size_;
  puVar6 = (undefined8 *)moreData.size_;
  pAVar4 = moreData.ptr;
  sVar2 = fds.size_;
  if (pAVar4 == (ArrayPtr<const_unsigned_char> *)0x0) {
    do {
      puVar7 = puVar6;
      bVar8 = in_R9 == 0;
      in_R9 = in_R9 + -1;
      if (bVar8) {
        local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
        pcStack_48 = " == ";
        local_40 = 5;
        local_38 = sVar2 == 0;
        local_58._0_8_ = sVar2;
        if (local_38) {
          kj::_::readyNow();
          return (PromiseBase)(PromiseBase)this;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[34]>
                  (&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x151,FAILED,"fds.size() == 0",
                   "_kjCondition,\"can\'t attach FDs to empty message\"",
                   (DebugComparison<unsigned_long,_int> *)local_58,
                   (char (*) [34])"can\'t attach FDs to empty message");
        kj::_::Debug::Fault::fatal(&local_60);
      }
      pAVar4 = (ArrayPtr<const_unsigned_char> *)puVar7[1];
      puVar6 = puVar7 + 2;
    } while (pAVar4 == (ArrayPtr<const_unsigned_char> *)0x0);
    puVar5 = (uchar *)*puVar7;
  }
  pAVar1 = (((AsyncPipe *)data.ptr)->state).ptr;
  if (pAVar1 == (AsyncCapabilityStream *)0x0) {
    pvVar3 = operator_new(0x400);
    *(undefined8 *)((long)pvVar3 + 0x1d8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
    *(undefined ***)((long)pvVar3 + 0x1d0) = &PTR_destroy_006df398;
    *(undefined ***)((long)pvVar3 + 0x1e8) = &PTR_reject_006df3e8;
    *(undefined1 *)((long)pvVar3 + 0x1f0) = 0;
    *(undefined1 *)((long)pvVar3 + 0x388) = 0;
    *(undefined1 *)((long)pvVar3 + 0x390) = 1;
    local_58._0_4_ = 1;
    local_58._8_8_ = fds.ptr;
    morePieces.size_._0_4_ = (int)in_R9;
    morePieces.ptr = (ArrayPtr<const_unsigned_char> *)puVar6;
    morePieces.size_._4_4_ = (int)((ulong)in_R9 >> 0x20);
    writeBuffer.size_ = (size_t)pAVar4;
    writeBuffer.ptr = puVar5;
    pcStack_48 = (char *)sVar2;
    BlockedWrite::BlockedWrite
              ((BlockedWrite *)((long)pvVar3 + 0x398),
               (PromiseFulfiller<void> *)((long)pvVar3 + 0x1e8),(AsyncPipe *)data.ptr,writeBuffer,
               morePieces,
               (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                *)local_58);
    OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
    ::destroy((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
               *)local_58);
    *(void **)((long)pvVar3 + 0x1d8) = pvVar3;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)((long)pvVar3 + 0x1d0);
  }
  else {
    (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0xe])
              (this,pAVar1,puVar5,pAVar4);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                             ArrayPtr<const ArrayPtr<const byte>> moreData,
                             ArrayPtr<const int> fds) override {
    while (data.size() == 0 && moreData.size() > 0) {
      data = moreData.front();
      moreData = moreData.slice(1, moreData.size());
    }

    if (data.size() == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't attach FDs to empty message");
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.writeWithFds(data, moreData, fds);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, data, moreData, fds);
    }
  }